

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O3

NodePtr __thiscall dh::analysis::unary_expr(analysis *this)

{
  undefined1 *puVar1;
  undefined8 this_00;
  undefined8 uVar2;
  undefined8 uVar3;
  element_type *this_01;
  int iVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  analysis *in_RSI;
  TreeNode *__tmp;
  bool bVar6;
  NodePtr NVar7;
  NodePtr tmp_in_ptr;
  NodePtr tmp_cur_ptr;
  string tmp_str;
  undefined1 local_119;
  undefined1 local_118 [32];
  undefined1 local_f8 [56];
  element_type *peStack_c0;
  string local_b0;
  string local_90;
  undefined1 local_70 [32];
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  
  this->layer_record = 0;
  this->initFlag = false;
  *(undefined3 *)&this->field_0x5 = 0;
  (this->current_tab).super___shared_ptr<dh::symTab,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_f8._48_8_ = (pointer)0x0;
  peStack_c0 = (element_type *)0x0;
  local_48 = 0;
  local_40[0] = 0;
  local_50 = local_40;
  token::getVal_abi_cxx11_
            ((string *)local_f8,
             (in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  iVar4 = std::__cxx11::string::compare(local_f8);
  if (iVar4 == 0) {
    bVar6 = true;
  }
  else {
    token::getVal_abi_cxx11_
              ((string *)local_118,
               (in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    iVar4 = std::__cxx11::string::compare(local_118);
    if (iVar4 == 0) {
      bVar6 = true;
    }
    else {
      token::getVal_abi_cxx11_
                (&local_b0,
                 (in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      iVar4 = std::__cxx11::string::compare((char *)&local_b0);
      bVar6 = iVar4 == 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_b0._M_dataplus._M_p._4_4_,(int)local_b0._M_dataplus._M_p) !=
          &local_b0.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_b0._M_dataplus._M_p._4_4_,(int)local_b0._M_dataplus._M_p));
      }
    }
    if ((undefined1 *)local_118._0_8_ != local_118 + 0x10) {
      operator_delete((void *)local_118._0_8_);
    }
  }
  puVar1 = local_f8 + 0x10;
  if ((undefined1 *)CONCAT44(local_f8._4_4_,local_f8._0_4_) != puVar1) {
    operator_delete((undefined1 *)CONCAT44(local_f8._4_4_,local_f8._0_4_));
  }
  if (!bVar6) {
    NVar7 = primary_expr((analysis *)local_f8);
    _Var5 = NVar7.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    this->layer_record = local_f8._0_4_;
    this->initFlag = (bool)(char)local_f8._4_4_;
    *(int3 *)&this->field_0x5 = SUB43(local_f8._4_4_,1);
    (this->current_tab).super___shared_ptr<dh::symTab,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_f8._8_8_;
    if (local_50 != local_40) {
      operator_delete(local_50);
      _Var5._M_pi = extraout_RDX;
    }
    if (peStack_c0 != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peStack_c0);
      _Var5._M_pi = extraout_RDX_00;
    }
    NVar7.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         _Var5._M_pi;
    NVar7.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
    ;
    return (NodePtr)NVar7.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>;
  }
  token::getVal_abi_cxx11_
            ((string *)local_f8,
             (in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  local_b0._M_dataplus._M_p._0_4_ =
       token::getLineno((in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr);
  local_118._0_8_ = (TreeNode *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<dh::TreeNode,std::allocator<dh::TreeNode>,std::__cxx11::string,int>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_118 + 8),(TreeNode **)local_118,
             (allocator<dh::TreeNode> *)(local_f8 + 0x20),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8,
             (int *)&local_b0);
  uVar3 = local_118._8_8_;
  this_00 = local_118._0_8_;
  local_118._0_8_ = (TreeNode *)0x0;
  uVar2 = local_118._0_8_;
  local_118._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_118._0_4_ = (undefined4)this_00;
  local_118[4] = SUB81(this_00,4);
  local_118._5_3_ = SUB83(this_00,5);
  this->layer_record = local_118._0_4_;
  this->initFlag = (bool)local_118[4];
  *(undefined3 *)&this->field_0x5 = local_118._5_3_;
  (this->current_tab).super___shared_ptr<dh::symTab,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)uVar3;
  local_118._0_8_ = uVar2;
  if ((undefined1 *)CONCAT44(local_f8._4_4_,local_f8._0_4_) != puVar1) {
    operator_delete((undefined1 *)CONCAT44(local_f8._4_4_,local_f8._0_4_));
  }
  local_f8._0_4_ = 1;
  TreeNode::setNodeKind((TreeNode *)this_00,(int *)local_f8);
  local_f8._0_4_ = 7;
  TreeNode::setKind((TreeNode *)this_00,(int *)local_f8);
  token::getVal_abi_cxx11_
            ((string *)local_70,
             (in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  match(in_RSI,(string *)local_70);
  if ((pointer)local_70._0_8_ != (pointer)(local_70 + 0x10)) {
    operator_delete((void *)local_70._0_8_);
  }
  local_f8._32_8_ = this_00;
  local_f8._40_8_ = uVar3;
  if ((element_type *)uVar3 != (element_type *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&(((shared_ptr<dh::symTab> *)(uVar3 + 8))->
               super___shared_ptr<dh::symTab,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
           *(int *)&(((shared_ptr<dh::symTab> *)(uVar3 + 8))->
                    super___shared_ptr<dh::symTab,_(__gnu_cxx::_Lock_policy)2>)._M_ptr + 1;
      UNLOCK();
    }
    else {
      *(int *)&(((shared_ptr<dh::symTab> *)(uVar3 + 8))->
               super___shared_ptr<dh::symTab,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
           *(int *)&(((shared_ptr<dh::symTab> *)(uVar3 + 8))->
                    super___shared_ptr<dh::symTab,_(__gnu_cxx::_Lock_policy)2>)._M_ptr + 1;
    }
  }
  do {
    token::getVal_abi_cxx11_
              ((string *)local_f8,
               (in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    iVar4 = std::__cxx11::string::compare((char *)local_f8);
    if (iVar4 == 0) {
      bVar6 = true;
    }
    else {
      token::getVal_abi_cxx11_
                ((string *)local_118,
                 (in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      iVar4 = std::__cxx11::string::compare((char *)local_118);
      if (iVar4 == 0) {
        bVar6 = true;
      }
      else {
        token::getVal_abi_cxx11_
                  (&local_b0,
                   (in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        iVar4 = std::__cxx11::string::compare((char *)&local_b0);
        bVar6 = iVar4 == 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_b0._M_dataplus._M_p._4_4_,(int)local_b0._M_dataplus._M_p) !=
            &local_b0.field_2) {
          operator_delete((undefined1 *)
                          CONCAT44(local_b0._M_dataplus._M_p._4_4_,(int)local_b0._M_dataplus._M_p));
        }
      }
      if ((TreeNode *)local_118._0_8_ != (TreeNode *)(local_118 + 0x10)) {
        operator_delete((void *)local_118._0_8_);
      }
    }
    if ((undefined1 *)CONCAT44(local_f8._4_4_,local_f8._0_4_) != puVar1) {
      operator_delete((undefined1 *)CONCAT44(local_f8._4_4_,local_f8._0_4_));
    }
    if (bVar6) {
      token::getVal_abi_cxx11_
                ((string *)local_f8,
                 (in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      local_b0._M_dataplus._M_p._0_4_ =
           token::getLineno((in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr);
      local_118._0_8_ = (TreeNode *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<dh::TreeNode,std::allocator<dh::TreeNode>,std::__cxx11::string,int>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_118 + 8),
                 (TreeNode **)local_118,(allocator<dh::TreeNode> *)&local_119,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8,
                 (int *)&local_b0);
      if ((undefined1 *)CONCAT44(local_f8._4_4_,local_f8._0_4_) != puVar1) {
        operator_delete((undefined1 *)CONCAT44(local_f8._4_4_,local_f8._0_4_));
      }
      local_f8._0_4_ = 1;
      TreeNode::setNodeKind((TreeNode *)local_118._0_8_,(int *)local_f8);
      local_f8._0_4_ = 7;
      TreeNode::setKind((TreeNode *)local_118._0_8_,(int *)local_f8);
      token::getVal_abi_cxx11_
                (&local_90,
                 (in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      match(in_RSI,&local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      TreeNode::appendChild((TreeNode *)local_f8._32_8_,(NodePtr *)local_118);
      local_f8._32_8_ = local_118._0_8_;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_f8 + 0x28),
                 (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_118 + 8));
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_);
      }
    }
    else {
      primary_expr((analysis *)local_f8);
      this_01 = peStack_c0;
      local_f8._48_8_ = CONCAT44(local_f8._4_4_,local_f8._0_4_);
      peStack_c0 = (element_type *)local_f8._8_8_;
      if (this_01 != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01);
      }
      TreeNode::appendChild((TreeNode *)local_f8._32_8_,(NodePtr *)(local_f8 + 0x30));
    }
  } while( true );
}

Assistant:

NodePtr analysis::unary_expr()
{
#ifdef _DEBUG_
	::std::cout << "[DEBUG] in unary_expr\n";
#endif
	NodePtr ret;
	NodePtr tmp_ptr;
	::std::string tmp_str;

	if ( tmp->getVal() == "+"
			|| tmp->getVal() == "-"
			|| tmp->getVal() == "!")
	{
		ret = ::std::make_shared<TreeNode>(tmp->getVal(),tmp->getLineno());
		ret->setNodeKind(NodeKind::ExprK);
		ret->setKind(ExprKind::UnaryK);

		match(tmp->getVal());
	} else 
	{
		ret = primary_expr();
		return ret;
	}

	NodePtr tmp_cur_ptr = ret;
	while(1)
	{
		if ( tmp->getVal() == "+"
			|| tmp->getVal() == "-"
			|| tmp->getVal() == "!")
		{
			NodePtr tmp_in_ptr = ::std::make_shared<TreeNode>(tmp->getVal(),tmp->getLineno());
			tmp_in_ptr->setNodeKind(NodeKind::ExprK);
			tmp_in_ptr->setKind(ExprKind::UnaryK);

			match(tmp->getVal());
			tmp_cur_ptr->appendChild(tmp_in_ptr);
			tmp_cur_ptr = tmp_in_ptr;
		} else 
		{
			tmp_ptr = primary_expr();
			tmp_cur_ptr->appendChild(tmp_ptr);
		}
	}

	return ret;
}